

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_Group_Test::TestBody
          (ParseMessageTest_Group_Test *this)

{
  ParserTest::ExpectParsesTo
            (&this->super_ParseMessageTest,
             "message TestMessage {\n  optional group TestGroup = 1 {};\n}\n",
             "message_type {  name: \"TestMessage\"  nested_type { name: \"TestGroup\" }  field { name:\"testgroup\" label:LABEL_OPTIONAL number:1          type:TYPE_GROUP type_name: \"TestGroup\" }}"
            );
  return;
}

Assistant:

TEST_F(ParseMessageTest, Group) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  optional group TestGroup = 1 {};\n"
      "}\n",

      "message_type {"
      "  name: \"TestMessage\""
      "  nested_type { name: \"TestGroup\" }"
      "  field { name:\"testgroup\" label:LABEL_OPTIONAL number:1"
      "          type:TYPE_GROUP type_name: \"TestGroup\" }"
      "}");
}